

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-builder.h
# Opt level: O0

NumericExpr __thiscall
mp::ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_>::EndCall(void *param_1)

{
  Argument1 in_stack_ffffffffffffff98;
  allocator<char> local_39;
  string local_38 [8];
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  ExprBuilder *local_18;
  void *local_10;
  ExprBuilder local_5;
  BasicTestExpr<0> local_4;
  
  local_18 = &local_5;
  local_10 = param_1;
  internal::Unused<mp::ProblemBuilder<TestProblemBuilder,BasicTestExpr<0>>::ExprBuilder*>(&local_18)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  TestProblemBuilder::ReportUnhandledConstruct
            ((TestProblemBuilder *)param_1,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  BasicTestExpr<0>::BasicTestExpr(&local_4,NULL_ID);
  return (NumericExpr)local_4.id_;
}

Assistant:

NumericExpr EndCall(CallExprBuilder builder) {
    internal::Unused(&builder);
    MP_DISPATCH(ReportUnhandledConstruct("function call"));
    return NumericExpr();
  }